

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorArkode.H
# Opt level: O0

void __thiscall pele::physics::reactions::ReactorArkode::ReactorArkode(ReactorArkode *this)

{
  Register<pele::physics::reactions::ReactorArkode> *in_RDI;
  
  Factory<pele::physics::reactions::ReactorBase>::Register<pele::physics::reactions::ReactorArkode>
  ::Register(in_RDI);
  (in_RDI->super_ReactorBase).super_Factory<pele::physics::reactions::ReactorBase>._vptr_Factory =
       (_func_int **)&PTR__ReactorArkode_01aa2150;
  in_RDI[1].super_ReactorBase.super_Factory<pele::physics::reactions::ReactorBase>._vptr_Factory =
       (_func_int **)0x3eb0c6f7a0b5ed8d;
  *(undefined8 *)&in_RDI[1].super_ReactorBase.verbose = 0x3ddb7cdfd9d7bdbb;
  *(undefined4 *)in_RDI[1].super_ReactorBase.m_typ_vals._M_elems = 1;
  *(undefined4 *)((long)in_RDI[1].super_ReactorBase.m_typ_vals._M_elems + 4) = 0x28;
  *(undefined4 *)(in_RDI[1].super_ReactorBase.m_typ_vals._M_elems + 1) = 0;
  *(undefined4 *)(in_RDI[1].super_ReactorBase.m_typ_vals._M_elems + 2) = 0;
  *(undefined4 *)((long)in_RDI[1].super_ReactorBase.m_typ_vals._M_elems + 0x14) = 1;
  *(undefined1 *)(in_RDI[1].super_ReactorBase.m_typ_vals._M_elems + 3) = 0;
  return;
}

Assistant:

static std::string identifier() { return "ReactorArkode"; }